

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O0

Am_Object Am_Get_About_Amulet_Window(void)

{
  bool bVar1;
  char *file_name;
  Am_Wrapper *pAVar2;
  Am_Object *pAVar3;
  Am_Method_Wrapper *value;
  Am_Value *pAVar4;
  Am_Constraint *pAVar5;
  Am_Object *pAVar6;
  Am_Value_List *pAVar7;
  Am_Object_Data *in_RDI;
  Am_Input_Char local_15c;
  Am_Value local_158;
  Am_Input_Char local_144;
  Am_Value local_140;
  Am_Value_List local_130;
  Am_Object local_120;
  Am_Object local_118;
  Am_Object local_110;
  Am_Font local_108;
  Am_Object local_100;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Formula local_98;
  Am_Formula local_88;
  Am_Formula local_78;
  Am_Formula local_68;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object bitmap;
  Am_Image_Array local_38;
  Am_Image_Array picture;
  char *pathname;
  Am_Font bigfont;
  
  bVar1 = Am_Object::Valid(&am_about_amulet_window);
  if (!bVar1) {
    Am_Font::Am_Font((Am_Font *)&pathname,Am_FONT_SERIF,true,false,false,Am_FONT_LARGE);
    file_name = Am_Merge_Pathname("images/aboutamulet.gif");
    Am_Image_Array::Am_Image_Array(&local_38,file_name);
    if (file_name != (char *)0x0) {
      operator_delete__(file_name);
    }
    bVar1 = Am_Image_Array::Valid(&local_38);
    if (bVar1) {
      Am_Object::Create(&local_50,(char *)&Am_Bitmap);
      pAVar2 = Am_Image_Array::operator_cast_to_Am_Wrapper_(&local_38);
      pAVar3 = Am_Object::Set(&local_50,0xb0,pAVar2,0);
      Am_Object::Am_Object(&local_48,pAVar3);
      Am_Object::~Am_Object(&local_50);
      Am_Object::Create(&local_58,(char *)&Am_Window);
      value = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_
                        (&Am_Default_Pop_Up_Window_Destroy_Method);
      pAVar3 = Am_Object::Set(&local_58,0x89,value,0);
      pAVar4 = Am_Object::Get(&local_48,0x66,0);
      pAVar3 = Am_Object::Set(pAVar3,0x66,pAVar4,0);
      pAVar4 = Am_Object::Get(&local_48,0x67,0);
      pAVar3 = Am_Object::Set(pAVar3,0x67,pAVar4,0);
      pAVar3 = Am_Object::Set(pAVar3,0x6c,"About Amulet",0);
      pAVar3 = Am_Object::Set(pAVar3,0x6d,"About Amulet",0);
      pAVar3 = Am_Object::Set(pAVar3,0x74,true,0);
      pAVar3 = Am_Object::Set(pAVar3,0x72,true,0);
      pAVar3 = Am_Object::Set(pAVar3,0x75,true,0);
      pAVar3 = Am_Object::Set(pAVar3,0x73,true,0);
      Am_Same_As((Am_Slot_Key)&local_68);
      pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_(&local_68);
      pAVar3 = Am_Object::Set(pAVar3,0x70,pAVar5,0);
      Am_Same_As((Am_Slot_Key)&local_78);
      pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_(&local_78);
      pAVar3 = Am_Object::Set(pAVar3,0x6e,pAVar5,0);
      Am_Same_As((Am_Slot_Key)&local_88);
      pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_(&local_88);
      pAVar3 = Am_Object::Set(pAVar3,0x71,pAVar5,0);
      Am_Same_As((Am_Slot_Key)&local_98);
      pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_(&local_98);
      pAVar3 = Am_Object::Set(pAVar3,0x6f,pAVar5,0);
      Am_Object::Am_Object(&local_a0,&local_48);
      pAVar3 = Am_Object::Add_Part(pAVar3,&local_a0,true,0);
      Am_Object::Create(&local_b0,(char *)&Am_Text);
      pAVar6 = Am_Object::Set(&local_b0,100,0xd2,0);
      pAVar6 = Am_Object::Set(pAVar6,0x65,0xc3,0);
      pAVar6 = Am_Object::Set(pAVar6,0xab,"Brad A. Myers,",0);
      pAVar2 = Am_Font::operator_cast_to_Am_Wrapper_((Am_Font *)&pathname);
      pAVar6 = Am_Object::Set(pAVar6,0xac,pAVar2,0);
      Am_Object::Am_Object(&local_a8,pAVar6);
      pAVar3 = Am_Object::Add_Part(pAVar3,&local_a8,true,0);
      Am_Object::Create(&local_c0,(char *)&Am_Text);
      pAVar6 = Am_Object::Set(&local_c0,100,0xd2,0);
      pAVar6 = Am_Object::Set(pAVar6,0x65,0xd7,0);
      pAVar6 = Am_Object::Set(pAVar6,0xab,"Rich McDaniel, Rob Miller,",0);
      pAVar2 = Am_Font::operator_cast_to_Am_Wrapper_((Am_Font *)&pathname);
      pAVar6 = Am_Object::Set(pAVar6,0xac,pAVar2,0);
      Am_Object::Am_Object(&local_b8,pAVar6);
      pAVar3 = Am_Object::Add_Part(pAVar3,&local_b8,true,0);
      Am_Object::Create(&local_d0,(char *)&Am_Text);
      pAVar6 = Am_Object::Set(&local_d0,100,0xd2,0);
      pAVar6 = Am_Object::Set(pAVar6,0x65,0xeb,0);
      pAVar6 = Am_Object::Set(pAVar6,0xab,"Alan Ferrency, Patrick Doane,",0);
      pAVar2 = Am_Font::operator_cast_to_Am_Wrapper_((Am_Font *)&pathname);
      pAVar6 = Am_Object::Set(pAVar6,0xac,pAVar2,0);
      Am_Object::Am_Object(&local_c8,pAVar6);
      pAVar3 = Am_Object::Add_Part(pAVar3,&local_c8,true,0);
      Am_Object::Create(&local_e0,(char *)&Am_Text);
      pAVar6 = Am_Object::Set(&local_e0,100,0xd2,0);
      pAVar6 = Am_Object::Set(pAVar6,0x65,0xff,0);
      pAVar6 = Am_Object::Set(pAVar6,0xab,"Andrew Faulring, Ellen Borison",0);
      pAVar2 = Am_Font::operator_cast_to_Am_Wrapper_((Am_Font *)&pathname);
      pAVar6 = Am_Object::Set(pAVar6,0xac,pAVar2,0);
      Am_Object::Am_Object(&local_d8,pAVar6);
      pAVar3 = Am_Object::Add_Part(pAVar3,&local_d8,true,0);
      Am_Object::Create(&local_f0,(char *)&Am_Text);
      pAVar6 = Am_Object::Set(&local_f0,100,0xd2,0);
      pAVar6 = Am_Object::Set(pAVar6,0x65,0x113,0);
      pAVar6 = Am_Object::Set(pAVar6,0xab,"Andy Mickish, and Alex Klimovitski",0);
      pAVar2 = Am_Font::operator_cast_to_Am_Wrapper_((Am_Font *)&pathname);
      pAVar6 = Am_Object::Set(pAVar6,0xac,pAVar2,0);
      Am_Object::Am_Object(&local_e8,pAVar6);
      pAVar3 = Am_Object::Add_Part(pAVar3,&local_e8,true,0);
      Am_Object::Create(&local_100,(char *)&Am_Text);
      pAVar6 = Am_Object::Set(&local_100,100,0x1a3,0);
      pAVar6 = Am_Object::Set(pAVar6,0x65,0x78,0);
      pAVar6 = Am_Object::Set(pAVar6,0xab,"OpenAmulet 4.3 alpha N",0);
      Am_Font::Am_Font(&local_108,Am_FONT_SERIF,true,false,false,Am_FONT_VERY_LARGE);
      pAVar2 = Am_Font::operator_cast_to_Am_Wrapper_(&local_108);
      pAVar6 = Am_Object::Set(pAVar6,0xac,pAVar2,0);
      Am_Object::Am_Object(&local_f8,pAVar6);
      pAVar3 = Am_Object::Add_Part(pAVar3,&local_f8,true,0);
      Am_Object::Create(&local_118,(char *)&Am_One_Shot_Interactor);
      Am_Object::Create(&local_120,(char *)&Am_Standard_OK_Command);
      pAVar6 = Am_Object::Set_Part(&local_118,0xc5,&local_120,0);
      Am_Value_List::Am_Value_List(&local_130);
      Am_Input_Char::Am_Input_Char(&local_144,"ANY_MOUSE_DOWN",true);
      Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)&local_140);
      pAVar7 = Am_Value_List::Add(&local_130,&local_140,Am_TAIL,true);
      Am_Input_Char::Am_Input_Char(&local_15c,"RETURN",true);
      Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)&local_158);
      pAVar7 = Am_Value_List::Add(pAVar7,&local_158,Am_TAIL,true);
      pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar7);
      pAVar6 = Am_Object::Set(pAVar6,0xb9,pAVar2,0);
      Am_Object::Am_Object(&local_110,pAVar6);
      pAVar3 = Am_Object::Add_Part(pAVar3,&local_110,true,0);
      Am_Object::operator=(&am_about_amulet_window,pAVar3);
      Am_Object::~Am_Object(&local_110);
      Am_Value::~Am_Value(&local_158);
      Am_Value::~Am_Value(&local_140);
      Am_Value_List::~Am_Value_List(&local_130);
      Am_Object::~Am_Object(&local_120);
      Am_Object::~Am_Object(&local_118);
      Am_Object::~Am_Object(&local_f8);
      Am_Font::~Am_Font(&local_108);
      Am_Object::~Am_Object(&local_100);
      Am_Object::~Am_Object(&local_e8);
      Am_Object::~Am_Object(&local_f0);
      Am_Object::~Am_Object(&local_d8);
      Am_Object::~Am_Object(&local_e0);
      Am_Object::~Am_Object(&local_c8);
      Am_Object::~Am_Object(&local_d0);
      Am_Object::~Am_Object(&local_b8);
      Am_Object::~Am_Object(&local_c0);
      Am_Object::~Am_Object(&local_a8);
      Am_Object::~Am_Object(&local_b0);
      Am_Object::~Am_Object(&local_a0);
      Am_Formula::~Am_Formula(&local_98);
      Am_Formula::~Am_Formula(&local_88);
      Am_Formula::~Am_Formula(&local_78);
      Am_Formula::~Am_Formula(&local_68);
      Am_Object::~Am_Object(&local_58);
      Am_Object::~Am_Object(&local_48);
    }
    else {
      Am_Object::Am_Object((Am_Object *)in_RDI,&Am_No_Object);
    }
    bitmap.data._5_3_ = 0;
    bitmap.data._4_1_ = !bVar1;
    Am_Image_Array::~Am_Image_Array(&local_38);
    Am_Font::~Am_Font((Am_Font *)&pathname);
    if (bitmap.data._4_4_ != 0) {
      return (Am_Object)in_RDI;
    }
  }
  Am_Object::Am_Object((Am_Object *)in_RDI,&am_about_amulet_window);
  return (Am_Object)in_RDI;
}

Assistant:

Am_Object
Am_Get_About_Amulet_Window()
{
  if (!am_about_amulet_window.Valid()) {
    Am_Font bigfont = Am_Font(Am_FONT_SERIF, true, false, false, Am_FONT_LARGE);
    const char *pathname = Am_Merge_Pathname(ABOUT_AMULET_GIF);
    Am_Image_Array picture = Am_Image_Array(pathname);
    delete[] pathname;
    if (!picture.Valid()) {
      return Am_No_Object;
    }
    Am_Object bitmap =
        Am_Bitmap.Create(DSTR("About Amulet GIF")).Set(Am_IMAGE, picture);
    am_about_amulet_window =
        Am_Window.Create(DSTR("About Amulet"))
            .Set(Am_DESTROY_WINDOW_METHOD,
                 Am_Default_Pop_Up_Window_Destroy_Method)
            .Set(Am_WIDTH, bitmap.Get(Am_WIDTH))
            .Set(Am_HEIGHT, bitmap.Get(Am_HEIGHT))
            .Set(Am_TITLE, "About Amulet")
            .Set(Am_ICON_TITLE, "About Amulet")
            .Set(Am_USE_MIN_WIDTH, true)
            .Set(Am_USE_MAX_WIDTH, true)
            .Set(Am_USE_MIN_HEIGHT, true)
            .Set(Am_USE_MAX_HEIGHT, true)
            .Set(Am_MIN_WIDTH, Am_Same_As(Am_WIDTH))
            .Set(Am_MAX_WIDTH, Am_Same_As(Am_WIDTH))
            .Set(Am_MIN_HEIGHT, Am_Same_As(Am_HEIGHT))
            .Set(Am_MAX_HEIGHT, Am_Same_As(Am_HEIGHT))

            .Add_Part(bitmap)
            .Add_Part(Am_Text.Create()
                          .Set(Am_LEFT, 210)
                          .Set(Am_TOP, 195)
                          .Set(Am_TEXT, "Brad A. Myers,")
                          .Set(Am_FONT, bigfont))
            .Add_Part(Am_Text.Create()
                          .Set(Am_LEFT, 210)
                          .Set(Am_TOP, 215)
                          .Set(Am_TEXT, "Rich McDaniel, Rob Miller,")
                          .Set(Am_FONT, bigfont))
            .Add_Part(Am_Text.Create()
                          .Set(Am_LEFT, 210)
                          .Set(Am_TOP, 235)
                          .Set(Am_TEXT, "Alan Ferrency, Patrick Doane,")
                          .Set(Am_FONT, bigfont))
            .Add_Part(Am_Text.Create()
                          .Set(Am_LEFT, 210)
                          .Set(Am_TOP, 255)
                          .Set(Am_TEXT, "Andrew Faulring, Ellen Borison")
                          .Set(Am_FONT, bigfont))
            .Add_Part(Am_Text.Create()
                          .Set(Am_LEFT, 210)
                          .Set(Am_TOP, 275)
                          .Set(Am_TEXT, "Andy Mickish, and Alex Klimovitski")
                          .Set(Am_FONT, bigfont))
            .Add_Part(Am_Text.Create()
                          .Set(Am_LEFT, 419)
                          .Set(Am_TOP, 120)
                          .Set(Am_TEXT, Am_VERSION)
                          .Set(Am_FONT, Am_Font(Am_FONT_SERIF, true, false,
                                                false, Am_FONT_VERY_LARGE)))
            .Add_Part(Am_One_Shot_Interactor.Create()
                          .Set_Part(Am_COMMAND, Am_Standard_OK_Command.Create())
                          .Set(Am_START_WHEN,
                               Am_Value_List()
                                   .Add(Am_Input_Char("ANY_MOUSE_DOWN"))
                                   .Add(Am_Input_Char("RETURN"))));
  }
  return am_about_amulet_window;
}